

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flat_hash_map.hpp
# Opt level: O1

pair<ska::detailv3::sherwood_v3_table<slang::SVInt,_slang::SVInt,_std::hash<slang::SVInt>,_ska::detailv3::functor_storage<unsigned_long,_std::hash<slang::SVInt>_>,_std::equal_to<slang::SVInt>,_ska::detailv3::functor_storage<bool,_std::equal_to<slang::SVInt>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::SVInt>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::SVInt>,_8UL>_>::templated_iterator<slang::SVInt>,_bool>
 __thiscall
ska::detailv3::
sherwood_v3_table<slang::SVInt,slang::SVInt,std::hash<slang::SVInt>,ska::detailv3::functor_storage<unsigned_long,std::hash<slang::SVInt>>,std::equal_to<slang::SVInt>,ska::detailv3::functor_storage<bool,std::equal_to<slang::SVInt>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::SVInt>,8ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::SVInt>,8ul>>
::emplace_new_key<slang::SVInt&>
          (sherwood_v3_table<slang::SVInt,slang::SVInt,std::hash<slang::SVInt>,ska::detailv3::functor_storage<unsigned_long,std::hash<slang::SVInt>>,std::equal_to<slang::SVInt>,ska::detailv3::functor_storage<bool,std::equal_to<slang::SVInt>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::SVInt>,8ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::SVInt>,8ul>>
           *this,int8_t distance_from_desired,EntryPointer current_entry,SVInt *key)

{
  long lVar1;
  char cVar2;
  long lVar3;
  EntryPointer psVar4;
  EntryPointer psVar5;
  anon_union_16_1_a8c68091_for_sherwood_v3_entry<slang::SVInt>_3 *rhs;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 aVar6;
  EntryPointer psVar7;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 aVar8;
  long lVar9;
  undefined7 uVar11;
  ulong uVar10;
  char __tmp;
  size_t sVar12;
  char __tmp_1;
  sherwood_v3_table<slang::SVInt,slang::SVInt,std::hash<slang::SVInt>,ska::detailv3::functor_storage<unsigned_long,std::hash<slang::SVInt>>,std::equal_to<slang::SVInt>,ska::detailv3::functor_storage<bool,std::equal_to<slang::SVInt>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::SVInt>,8ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::SVInt>,8ul>>
  sVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  pair<ska::detailv3::sherwood_v3_table<slang::SVInt,_slang::SVInt,_std::hash<slang::SVInt>,_ska::detailv3::functor_storage<unsigned_long,_std::hash<slang::SVInt>_>,_std::equal_to<slang::SVInt>,_ska::detailv3::functor_storage<bool,_std::equal_to<slang::SVInt>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::SVInt>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::SVInt>,_8UL>_>::templated_iterator<slang::SVInt>,_bool>
  pVar16;
  value_type to_insert;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 local_58;
  uint local_50;
  undefined1 local_4c;
  byte local_4b;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 local_48;
  uint local_40;
  undefined1 local_3c;
  byte local_3b;
  anon_union_16_1_a8c68091_for_sherwood_v3_entry<slang::SVInt>_3 *local_38;
  
  lVar3 = *(long *)(this + 0x10);
  if ((lVar3 != 0) &&
     (this[0x19] !=
      (sherwood_v3_table<slang::SVInt,slang::SVInt,std::hash<slang::SVInt>,ska::detailv3::functor_storage<unsigned_long,std::hash<slang::SVInt>>,std::equal_to<slang::SVInt>,ska::detailv3::functor_storage<bool,std::equal_to<slang::SVInt>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::SVInt>,8ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::SVInt>,8ul>>
       )distance_from_desired)) {
    lVar9 = *(long *)(this + 0x20) + 1;
    auVar14._8_4_ = (int)((ulong)lVar9 >> 0x20);
    auVar14._0_8_ = lVar9;
    auVar14._12_4_ = 0x45300000;
    lVar1 = lVar3 + 1;
    auVar15._8_4_ = (int)((ulong)lVar1 >> 0x20);
    auVar15._0_8_ = lVar1;
    auVar15._12_4_ = 0x45300000;
    if ((auVar14._8_8_ - 1.9342813113834067e+25) +
        ((double)CONCAT44(0x43300000,(int)lVar9) - 4503599627370496.0) <=
        (double)*(float *)(this + 0x1c) *
        ((auVar15._8_8_ - 1.9342813113834067e+25) +
        ((double)CONCAT44(0x43300000,(int)lVar1) - 4503599627370496.0))) {
      uVar11 = (undefined7)((ulong)this >> 8);
      if (current_entry->distance_from_desired < '\0') {
        slang::SVInt::SVInt(&(current_entry->field_1).value,&key->super_SVIntStorage);
        current_entry->distance_from_desired = distance_from_desired;
        *(long *)(this + 0x20) = *(long *)(this + 0x20) + 1;
        uVar10 = CONCAT71(uVar11,1);
      }
      else {
        slang::SVInt::SVInt((SVInt *)&local_58,&key->super_SVIntStorage);
        local_48 = local_58;
        cVar2 = current_entry->distance_from_desired;
        current_entry->distance_from_desired = distance_from_desired;
        local_38 = &current_entry->field_1;
        local_40 = local_50;
        local_3c = local_4c;
        local_3b = local_4b;
        if (0x40 < local_50 || (local_4b & 1) != 0) {
          local_58.val = 0;
        }
        slang::SVInt::operator=((SVInt *)&local_58,&local_38->value);
        slang::SVInt::operator=(&local_38->value,(SVInt *)&local_48);
        if (((0x40 < local_40) || ((local_3b & 1) != 0)) &&
           ((uint64_t *)local_48.val != (uint64_t *)0x0)) {
          operator_delete__(local_48.pVal);
        }
        sVar13 = (sherwood_v3_table<slang::SVInt,slang::SVInt,std::hash<slang::SVInt>,ska::detailv3::functor_storage<unsigned_long,std::hash<slang::SVInt>>,std::equal_to<slang::SVInt>,ska::detailv3::functor_storage<bool,std::equal_to<slang::SVInt>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::SVInt>,8ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::SVInt>,8ul>>
                  )(cVar2 + '\x01');
        cVar2 = current_entry[1].distance_from_desired;
        psVar7 = current_entry + 1;
        psVar5 = current_entry;
        aVar8 = local_58;
        aVar6 = local_48;
        rhs = local_38;
        while (local_48 = aVar8, psVar4 = psVar7, local_58 = local_48, local_38 = rhs, -1 < cVar2) {
          if (cVar2 < (char)sVar13) {
            psVar4->distance_from_desired = (int8_t)sVar13;
            if (0x40 < local_50 || (local_4b & 1) != 0) {
              local_58.val = 0;
            }
            local_40 = local_50;
            local_3c = local_4c;
            local_3b = local_4b;
            slang::SVInt::operator=((SVInt *)&local_58,&(psVar4->field_1).value);
            slang::SVInt::operator=(&(psVar4->field_1).value,(SVInt *)&local_48);
            if (((0x40 < local_40) || ((local_3b & 1) != 0)) &&
               ((uint64_t *)local_48.val != (uint64_t *)0x0)) {
              operator_delete__(local_48.pVal);
            }
            sVar13 = (sherwood_v3_table<slang::SVInt,slang::SVInt,std::hash<slang::SVInt>,ska::detailv3::functor_storage<unsigned_long,std::hash<slang::SVInt>>,std::equal_to<slang::SVInt>,ska::detailv3::functor_storage<bool,std::equal_to<slang::SVInt>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::SVInt>,8ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::SVInt>,8ul>>
                      )(cVar2 + '\x01');
            aVar6 = local_48;
          }
          else {
            sVar13 = (sherwood_v3_table<slang::SVInt,slang::SVInt,std::hash<slang::SVInt>,ska::detailv3::functor_storage<unsigned_long,std::hash<slang::SVInt>>,std::equal_to<slang::SVInt>,ska::detailv3::functor_storage<bool,std::equal_to<slang::SVInt>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::SVInt>,8ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::SVInt>,8ul>>
                      )((char)sVar13 + '\x01');
            if (sVar13 == this[0x19]) {
              if (0x40 < local_50 || (local_4b & 1) != 0) {
                local_58.val = 0;
              }
              local_40 = local_50;
              local_3c = local_4c;
              local_3b = local_4b;
              slang::SVInt::operator=((SVInt *)&local_58,&rhs->value);
              slang::SVInt::operator=(&rhs->value,(SVInt *)&local_48);
              if (((0x40 < local_40) || ((local_3b & 1) != 0)) &&
                 ((uint64_t *)local_48.val != (uint64_t *)0x0)) {
                operator_delete__(local_48.pVal);
              }
              uVar10 = *(long *)(this + 0x10) * 2 + 2;
              sVar12 = 4;
              if (4 < uVar10) {
                sVar12 = uVar10;
              }
              sherwood_v3_table<slang::SVInt,_slang::SVInt,_std::hash<slang::SVInt>,_ska::detailv3::functor_storage<unsigned_long,_std::hash<slang::SVInt>_>,_std::equal_to<slang::SVInt>,_ska::detailv3::functor_storage<bool,_std::equal_to<slang::SVInt>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::SVInt>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::SVInt>,_8UL>_>
              ::rehash((sherwood_v3_table<slang::SVInt,_slang::SVInt,_std::hash<slang::SVInt>,_ska::detailv3::functor_storage<unsigned_long,_std::hash<slang::SVInt>_>,_std::equal_to<slang::SVInt>,_ska::detailv3::functor_storage<bool,_std::equal_to<slang::SVInt>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::SVInt>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::SVInt>,_8UL>_>
                        *)this,sVar12);
              pVar16 = sherwood_v3_table<slang::SVInt,_slang::SVInt,_std::hash<slang::SVInt>,_ska::detailv3::functor_storage<unsigned_long,_std::hash<slang::SVInt>_>,_std::equal_to<slang::SVInt>,_ska::detailv3::functor_storage<bool,_std::equal_to<slang::SVInt>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::SVInt>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::SVInt>,_8UL>_>
                       ::emplace<slang::SVInt>
                                 ((sherwood_v3_table<slang::SVInt,_slang::SVInt,_std::hash<slang::SVInt>,_ska::detailv3::functor_storage<unsigned_long,_std::hash<slang::SVInt>_>,_std::equal_to<slang::SVInt>,_ska::detailv3::functor_storage<bool,_std::equal_to<slang::SVInt>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::SVInt>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::SVInt>,_8UL>_>
                                   *)this,(SVInt *)&local_58);
              current_entry = (EntryPointer)pVar16.first.current;
              uVar10 = (ulong)pVar16._8_4_;
              goto LAB_001bb0b8;
            }
          }
          local_48 = aVar6;
          psVar7 = psVar4 + 1;
          psVar5 = psVar4;
          aVar8 = local_58;
          aVar6 = local_48;
          rhs = local_38;
          cVar2 = psVar4[1].distance_from_desired;
        }
        psVar5[1].field_1.value.super_SVIntStorage.field_0.val = 0;
        *(uint *)((long)&psVar5[1].field_1 + 8) = local_50;
        *(undefined1 *)((long)&psVar5[1].field_1 + 0xc) = local_4c;
        *(byte *)((long)&psVar5[1].field_1 + 0xd) = local_4b;
        if (0x40 < local_50 || (local_4b & 1) != 0) {
          local_58.val = 0;
        }
        psVar5[1].field_1.value.super_SVIntStorage.field_0.pVal = (uint64_t *)local_48;
        psVar4->distance_from_desired = (int8_t)sVar13;
        *(long *)(this + 0x20) = *(long *)(this + 0x20) + 1;
        uVar10 = CONCAT71(uVar11,1);
        local_48 = aVar6;
LAB_001bb0b8:
        if (((0x40 < local_50) || ((local_4b & 1) != 0)) &&
           ((uint64_t *)local_58.val != (uint64_t *)0x0)) {
          operator_delete__(local_58.pVal);
        }
      }
      goto LAB_001bae19;
    }
  }
  uVar10 = lVar3 * 2 + 2;
  sVar12 = 4;
  if (4 < uVar10) {
    sVar12 = uVar10;
  }
  sherwood_v3_table<slang::SVInt,_slang::SVInt,_std::hash<slang::SVInt>,_ska::detailv3::functor_storage<unsigned_long,_std::hash<slang::SVInt>_>,_std::equal_to<slang::SVInt>,_ska::detailv3::functor_storage<bool,_std::equal_to<slang::SVInt>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::SVInt>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::SVInt>,_8UL>_>
  ::rehash((sherwood_v3_table<slang::SVInt,_slang::SVInt,_std::hash<slang::SVInt>,_ska::detailv3::functor_storage<unsigned_long,_std::hash<slang::SVInt>_>,_std::equal_to<slang::SVInt>,_ska::detailv3::functor_storage<bool,_std::equal_to<slang::SVInt>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::SVInt>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::SVInt>,_8UL>_>
            *)this,sVar12);
  pVar16 = emplace<slang::SVInt&>(this,key);
  current_entry = (EntryPointer)pVar16.first.current;
  uVar10 = (ulong)pVar16._8_4_;
LAB_001bae19:
  pVar16._8_8_ = uVar10 & 0xffffffff;
  pVar16.first.current = current_entry;
  return pVar16;
}

Assistant:

emplace_new_key(int8_t distance_from_desired, EntryPointer current_entry, Key && key, Args &&... args)
    {
        using std::swap;
        if (num_slots_minus_one == 0 || distance_from_desired == max_lookups || num_elements + 1 > (num_slots_minus_one + 1) * static_cast<double>(_max_load_factor))
        {
            grow();
            return emplace(std::forward<Key>(key), std::forward<Args>(args)...);
        }
        else if (current_entry->is_empty())
        {
            current_entry->emplace(distance_from_desired, std::forward<Key>(key), std::forward<Args>(args)...);
            ++num_elements;
            return { { current_entry }, true };
        }
        value_type to_insert(std::forward<Key>(key), std::forward<Args>(args)...);
        swap(distance_from_desired, current_entry->distance_from_desired);
        swap(to_insert, current_entry->value);
        iterator result = { current_entry };
        for (++distance_from_desired, ++current_entry;; ++current_entry)
        {
            if (current_entry->is_empty())
            {
                current_entry->emplace(distance_from_desired, std::move(to_insert));
                ++num_elements;
                return { result, true };
            }
            else if (current_entry->distance_from_desired < distance_from_desired)
            {
                swap(distance_from_desired, current_entry->distance_from_desired);
                swap(to_insert, current_entry->value);
                ++distance_from_desired;
            }
            else
            {
                ++distance_from_desired;
                if (distance_from_desired == max_lookups)
                {
                    swap(to_insert, result.current->value);
                    grow();
                    return emplace(std::move(to_insert));
                }
            }
        }
    }